

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oasis.h
# Opt level: O2

void initstreams(string *inFile,string *outFile)

{
  FILE *pFVar1;
  pointer pcVar2;
  
  if (outFile->_M_string_length != 0) {
    pFVar1 = freopen((outFile->_M_dataplus)._M_p,"wb",_stdout);
    if (pFVar1 == (FILE *)0x0) {
      pcVar2 = (outFile->_M_dataplus)._M_p;
      goto LAB_0010163a;
    }
  }
  if (inFile->_M_string_length != 0) {
    pFVar1 = freopen((inFile->_M_dataplus)._M_p,"rb",_stdin);
    if (pFVar1 == (FILE *)0x0) {
      pcVar2 = (inFile->_M_dataplus)._M_p;
LAB_0010163a:
      fprintf(_stderr,"%s: Error opening file %s\n","initstreams",pcVar2);
      exit(-1);
    }
  }
  freopen((char *)0x0,"a+b",_stdout);
  freopen((char *)0x0,"rb",_stdin);
  return;
}

Assistant:

inline void initstreams(std::string inFile="", std::string outFile="")
{

   if (outFile.length() > 0){
       if (freopen(outFile.c_str(), "wb", stdout) == NULL) {
		   fprintf(stderr, "%s: Error opening file %s\n", __func__, outFile.c_str());
           exit(-1);
        }
   }

   if (inFile.length() > 0){
        if (freopen(inFile.c_str(), "rb", stdin) == NULL) {
			fprintf(stderr, "%s: Error opening file %s\n", __func__, inFile.c_str());
            exit(-1);
         }
   }

#if defined(_MSC_VER) || defined(__MINGW32__)
	_setmode(_fileno(stdout), O_BINARY);
	_setmode(_fileno(stdin), O_BINARY);
#elif __APPLE__
	freopen(NULL, "wb", stdout);
	freopen(NULL, "rb", stdin);
#elif __linux
	freopen(NULL, "a+b", stdout);
	freopen(NULL, "rb", stdin);
#endif

}